

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml.c
# Opt level: O3

ggml_tensor * ggml_permute(ggml_context *ctx,ggml_tensor *a,int axis0,int axis1,int axis2,int axis3)

{
  ggml_tensor *tensor;
  char *pcVar1;
  int line;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  int nb [4];
  int ne [4];
  undefined4 local_58 [4];
  undefined4 local_48 [6];
  
  if ((uint)axis0 < 4) {
    if ((uint)axis1 < 4) {
      if ((uint)axis2 < 4) {
        if ((uint)axis3 < 4) {
          if (axis0 == axis1) {
            pcVar1 = "axis0 != axis1";
            line = 0xcbb;
          }
          else if (axis0 == axis2) {
            pcVar1 = "axis0 != axis2";
            line = 0xcbc;
          }
          else if (axis0 == axis3) {
            pcVar1 = "axis0 != axis3";
            line = 0xcbd;
          }
          else if (axis1 == axis2) {
            pcVar1 = "axis1 != axis2";
            line = 0xcbe;
          }
          else if (axis1 == axis3) {
            pcVar1 = "axis1 != axis3";
            line = 0xcbf;
          }
          else {
            if (axis2 != axis3) {
              tensor = ggml_view_tensor(ctx,a);
              ggml_format_name(tensor,"%s (permuted)",a->name);
              local_48[(uint)axis0] = (int)a->ne[0];
              local_48[(uint)axis1] = (int)a->ne[1];
              local_48[(uint)axis2] = (int)a->ne[2];
              local_48[(uint)axis3] = (int)a->ne[3];
              local_58[(uint)axis0] = (int)a->nb[0];
              local_58[(uint)axis1] = (int)a->nb[1];
              local_58[(uint)axis2] = (int)a->nb[2];
              local_58[(uint)axis3] = (int)a->nb[3];
              auVar5._0_8_ = local_48._8_8_;
              auVar2._0_8_ = local_48._0_8_;
              auVar2._8_4_ = local_48[1];
              auVar2._12_4_ = -(uint)(local_48[1] < 0);
              auVar5._8_4_ = local_48[3];
              auVar5._12_4_ = -(uint)(local_48[3] < 0);
              tensor->ne[2] = CONCAT44(-(uint)(local_48[2] < 0),local_48[2]);
              tensor->ne[3] = auVar5._8_8_;
              tensor->ne[0] = CONCAT44(-(uint)(local_48[0] < 0),local_48[0]);
              tensor->ne[1] = auVar2._8_8_;
              auVar4._0_8_ = local_58._8_8_;
              auVar4._8_4_ = local_58[3];
              auVar4._12_4_ = -(uint)(local_58[3] < 0);
              auVar3._0_8_ = local_58._0_8_;
              auVar3._8_4_ = local_58[1];
              auVar3._12_4_ = -(uint)(local_58[1] < 0);
              tensor->nb[0] = CONCAT44(-(uint)(local_58[0] < 0),local_58[0]);
              tensor->nb[1] = auVar3._8_8_;
              tensor->nb[2] = CONCAT44(-(uint)(local_58[2] < 0),local_58[2]);
              tensor->nb[3] = auVar4._8_8_;
              tensor->op = GGML_OP_PERMUTE;
              tensor->src[0] = a;
              tensor->op_params[0] = axis0;
              tensor->op_params[1] = axis1;
              tensor->op_params[2] = axis2;
              tensor->op_params[3] = axis3;
              return tensor;
            }
            pcVar1 = "axis2 != axis3";
            line = 0xcc0;
          }
        }
        else {
          pcVar1 = "axis3 >= 0 && axis3 < GGML_MAX_DIMS";
          line = 0xcb9;
        }
      }
      else {
        pcVar1 = "axis2 >= 0 && axis2 < GGML_MAX_DIMS";
        line = 0xcb8;
      }
    }
    else {
      pcVar1 = "axis1 >= 0 && axis1 < GGML_MAX_DIMS";
      line = 0xcb7;
    }
  }
  else {
    pcVar1 = "axis0 >= 0 && axis0 < GGML_MAX_DIMS";
    line = 0xcb6;
  }
  ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/ggml.c",line,
             "GGML_ASSERT(%s) failed",pcVar1);
}

Assistant:

struct ggml_tensor * ggml_permute(
        struct ggml_context * ctx,
        struct ggml_tensor  * a,
        int                   axis0,
        int                   axis1,
        int                   axis2,
        int                   axis3) {
    GGML_ASSERT(axis0 >= 0 && axis0 < GGML_MAX_DIMS);
    GGML_ASSERT(axis1 >= 0 && axis1 < GGML_MAX_DIMS);
    GGML_ASSERT(axis2 >= 0 && axis2 < GGML_MAX_DIMS);
    GGML_ASSERT(axis3 >= 0 && axis3 < GGML_MAX_DIMS);

    GGML_ASSERT(axis0 != axis1);
    GGML_ASSERT(axis0 != axis2);
    GGML_ASSERT(axis0 != axis3);
    GGML_ASSERT(axis1 != axis2);
    GGML_ASSERT(axis1 != axis3);
    GGML_ASSERT(axis2 != axis3);

    struct ggml_tensor * result = ggml_view_tensor(ctx, a);
    ggml_format_name(result, "%s (permuted)", a->name);

    int ne[GGML_MAX_DIMS];
    int nb[GGML_MAX_DIMS];

    ne[axis0] = a->ne[0];
    ne[axis1] = a->ne[1];
    ne[axis2] = a->ne[2];
    ne[axis3] = a->ne[3];

    nb[axis0] = a->nb[0];
    nb[axis1] = a->nb[1];
    nb[axis2] = a->nb[2];
    nb[axis3] = a->nb[3];

    result->ne[0] = ne[0];
    result->ne[1] = ne[1];
    result->ne[2] = ne[2];
    result->ne[3] = ne[3];

    result->nb[0] = nb[0];
    result->nb[1] = nb[1];
    result->nb[2] = nb[2];
    result->nb[3] = nb[3];

    result->op     = GGML_OP_PERMUTE;
    result->src[0] = a;

    int32_t params[] = { axis0, axis1, axis2, axis3 };
    ggml_set_op_params(result, params, sizeof(params));

    return result;
}